

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_NtkUpdateLevel(Abc_Obj_t *pObjNew,Vec_Vec_t *vLevels)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  int local_38;
  int local_34;
  int m;
  int k;
  int Lev;
  int LevelOld;
  Abc_Obj_t *pTemp;
  Abc_Obj_t *pFanout;
  Vec_Vec_t *vLevels_local;
  Abc_Obj_t *pObjNew_local;
  
  m = Abc_ObjLevel(pObjNew);
  iVar1 = Abc_ObjLevelNew(pObjNew);
  if (m != iVar1) {
    Vec_VecClear(vLevels);
    Vec_VecPush(vLevels,m,pObjNew);
    *(uint *)&pObjNew->field_0x14 = *(uint *)&pObjNew->field_0x14 & 0xffffffef | 0x10;
    for (; iVar1 = Vec_VecSize(vLevels), m < iVar1; m = m + 1) {
      local_34 = 0;
      while( true ) {
        pVVar2 = Vec_VecEntry(vLevels,m);
        iVar1 = Vec_PtrSize(pVVar2);
        if (iVar1 <= local_34) break;
        pVVar2 = Vec_VecEntry(vLevels,m);
        pObj = (Abc_Obj_t *)Vec_PtrEntry(pVVar2,local_34);
        *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffef;
        iVar1 = Abc_ObjLevel(pObj);
        if (iVar1 != m) {
          __assert_fail("Abc_ObjLevel(pTemp) == Lev",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                        ,0x514,"void Abc_NtkUpdateLevel(Abc_Obj_t *, Vec_Vec_t *)");
        }
        iVar1 = Abc_ObjLevelNew(pObj);
        Abc_ObjSetLevel(pObj,iVar1);
        iVar1 = Abc_ObjLevel(pObj);
        if (iVar1 != m) {
          for (local_38 = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_38 < iVar1;
              local_38 = local_38 + 1) {
            pObj_00 = Abc_ObjFanout(pObj,local_38);
            iVar1 = Abc_ObjIsCo(pObj_00);
            if ((iVar1 == 0) && ((*(uint *)&pObj_00->field_0x14 >> 4 & 1) == 0)) {
              iVar1 = Abc_ObjLevel(pObj_00);
              if (iVar1 < m) {
                __assert_fail("Abc_ObjLevel(pFanout) >= Lev",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                              ,0x51e,"void Abc_NtkUpdateLevel(Abc_Obj_t *, Vec_Vec_t *)");
              }
              iVar1 = Abc_ObjLevel(pObj_00);
              Vec_VecPush(vLevels,iVar1,pObj_00);
              *(uint *)&pObj_00->field_0x14 = *(uint *)&pObj_00->field_0x14 & 0xffffffef | 0x10;
            }
          }
        }
        local_34 = local_34 + 1;
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkUpdateLevel( Abc_Obj_t * pObjNew, Vec_Vec_t * vLevels )
{
    Abc_Obj_t * pFanout, * pTemp;
    int LevelOld, Lev, k, m;
//    int Counter = 0, CounterMax = 0;
    // check if level has changed
    LevelOld = Abc_ObjLevel(pObjNew);
    if ( LevelOld == Abc_ObjLevelNew(pObjNew) )
        return;
    // start the data structure for level update
    // we cannot fail to visit a node when using this structure because the 
    // nodes are stored by their _old_ levels, which are assumed to be correct
    Vec_VecClear( vLevels );
    Vec_VecPush( vLevels, LevelOld, pObjNew );
    pObjNew->fMarkA = 1;
    // recursively update level
    Vec_VecForEachEntryStart( Abc_Obj_t *, vLevels, pTemp, Lev, k, LevelOld )
    {
//        Counter--;
        pTemp->fMarkA = 0;
        assert( Abc_ObjLevel(pTemp) == Lev );
        Abc_ObjSetLevel( pTemp, Abc_ObjLevelNew(pTemp) );
        // if the level did not change, no need to check the fanout levels
        if ( Abc_ObjLevel(pTemp) == Lev )
            continue;
        // schedule fanout for level update
        Abc_ObjForEachFanout( pTemp, pFanout, m )
        {
            if ( !Abc_ObjIsCo(pFanout) && !pFanout->fMarkA )
            {
                assert( Abc_ObjLevel(pFanout) >= Lev );
                Vec_VecPush( vLevels, Abc_ObjLevel(pFanout), pFanout );
//                Counter++;
//                CounterMax = Abc_MaxFloat( CounterMax, Counter );
                pFanout->fMarkA = 1;
            }
        }
    }
//    printf( "%d ", CounterMax );
}